

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O3

Image * LoadImageFromMemory(Image *__return_storage_ptr__,char *fileType,uchar *fileData,
                           int dataSize)

{
  ushort *puVar1;
  undefined1 uVar2;
  uint uVar3;
  int iVar4;
  _Bool _Var5;
  uint uVar6;
  char *__src;
  uchar *puVar7;
  float *__ptr;
  void *__dest;
  long lVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  size_t sVar12;
  int iVar13;
  int iVar14;
  int comp;
  char fileExtLower [16];
  int local_12c;
  char local_128 [16];
  size_t local_118;
  stbi__context local_110;
  
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->width = 0;
  __return_storage_ptr__->height = 0;
  __return_storage_ptr__->mipmaps = 0;
  __return_storage_ptr__->format = 0;
  local_128[0] = '\0';
  local_128[1] = '\0';
  local_128[2] = '\0';
  local_128[3] = '\0';
  local_128[4] = '\0';
  local_128[5] = '\0';
  local_128[6] = '\0';
  local_128[7] = '\0';
  local_128[8] = '\0';
  local_128[9] = '\0';
  local_128[10] = '\0';
  local_128[0xb] = '\0';
  local_128[0xc] = '\0';
  local_128[0xd] = '\0';
  local_128[0xe] = '\0';
  local_128[0xf] = '\0';
  __src = TextToLower(fileType);
  strcpy(local_128,__src);
  _Var5 = TextIsEqual(local_128,".png");
  local_110.img_buffer = fileData;
  local_110.img_buffer_original = fileData;
  if ((_Var5) || (_Var5 = TextIsEqual(local_128,".gif"), _Var5)) {
    if (fileData == (uchar *)0x0) {
      return __return_storage_ptr__;
    }
    local_12c = 0;
    local_110.io.read = (_func_int_void_ptr_char_ptr_int *)0x0;
    local_110.read_from_callbacks = 0;
    local_110.callback_already_read = 0;
    local_110.img_buffer_end = fileData + dataSize;
    local_110.img_buffer_original_end = local_110.img_buffer_end;
    puVar7 = stbi__load_and_postprocess_8bit
                       (&local_110,&__return_storage_ptr__->width,&__return_storage_ptr__->height,
                        &local_12c,0);
    __return_storage_ptr__->data = puVar7;
    __return_storage_ptr__->mipmaps = 1;
    if (3 < local_12c - 1U) {
      return __return_storage_ptr__;
    }
    __return_storage_ptr__->format = *(int *)(&DAT_00164c60 + (ulong)(local_12c - 1U) * 4);
    return __return_storage_ptr__;
  }
  _Var5 = TextIsEqual(local_128,".hdr");
  if (_Var5) {
    if (fileData == (uchar *)0x0) {
      return __return_storage_ptr__;
    }
    local_12c = 0;
    local_110.io.read = (_func_int_void_ptr_char_ptr_int *)0x0;
    local_110.read_from_callbacks = 0;
    local_110.callback_already_read = 0;
    local_110.img_buffer_end = fileData + dataSize;
    local_110.img_buffer_original_end = local_110.img_buffer_end;
    __ptr = stbi__loadf_main(&local_110,&__return_storage_ptr__->width,
                             &__return_storage_ptr__->height,&local_12c,0);
    __return_storage_ptr__->data = __ptr;
    __return_storage_ptr__->mipmaps = 1;
    if (local_12c == 4) {
      __return_storage_ptr__->format = 10;
      return __return_storage_ptr__;
    }
    if (local_12c == 3) {
      __return_storage_ptr__->format = 9;
      return __return_storage_ptr__;
    }
    if (local_12c == 1) {
      __return_storage_ptr__->format = 8;
      return __return_storage_ptr__;
    }
    TraceLog(4,"IMAGE: HDR file format not supported");
    free(__ptr);
    return __return_storage_ptr__;
  }
  _Var5 = TextIsEqual(local_128,".dds");
  if (!_Var5) {
    TraceLog(4,"IMAGE: File format not supported");
    return __return_storage_ptr__;
  }
  if (fileData == (uchar *)0x0) {
LAB_00139c95:
    iVar13 = 0;
    iVar10 = 0;
    iVar14 = 0;
  }
  else {
    if ((((*fileData != 'D') || (fileData[1] != 'D')) || (fileData[2] != 'S')) ||
       (fileData[3] != ' ')) {
      TraceLog(4,"IMAGE: DDS file data not valid");
      goto LAB_00139c95;
    }
    puVar7 = fileData + 0x80;
    iVar10 = *(int *)(fileData + 0xc);
    uVar6 = *(uint *)(fileData + 0x1c);
    iVar14 = uVar6 + (uVar6 == 0);
    iVar13 = *(int *)(fileData + 0x10);
    iVar11 = *(int *)(fileData + 0x58);
    uVar3 = *(uint *)(fileData + 0x50);
    if (iVar11 == 0x10) {
      if (uVar3 == 0x40) {
        sVar12 = (size_t)(iVar10 * iVar13 * 2);
        __dest = malloc(sVar12);
        memcpy(__dest,puVar7,sVar12);
        iVar11 = 3;
        goto LAB_00139ca0;
      }
      if (uVar3 == 0x41) {
        if (*(int *)(fileData + 0x68) == 0x8000) {
          uVar6 = iVar10 * iVar13;
          __dest = malloc((long)(int)(uVar6 * 2));
          memcpy(__dest,puVar7,(long)(int)(uVar6 * 2));
          iVar11 = 5;
          if (0 < (int)uVar6) {
            uVar9 = 0;
            do {
              puVar1 = (ushort *)((long)__dest + uVar9 * 2);
              *puVar1 = *puVar1 << 1 | (ushort)((short)*puVar1 < 0);
              uVar9 = uVar9 + 1;
            } while (uVar6 != uVar9);
          }
          goto LAB_00139ca0;
        }
        if (*(int *)(fileData + 0x68) == 0xf000) {
          uVar6 = iVar10 * iVar13;
          __dest = malloc((long)(int)(uVar6 * 2));
          memcpy(__dest,puVar7,(long)(int)(uVar6 * 2));
          iVar11 = 6;
          if (0 < (int)uVar6) {
            uVar9 = 0;
            do {
              puVar1 = (ushort *)((long)__dest + uVar9 * 2);
              *puVar1 = *puVar1 << 4 | *puVar1 >> 0xc;
              uVar9 = uVar9 + 1;
            } while (uVar6 != uVar9);
          }
          goto LAB_00139ca0;
        }
      }
    }
    else {
      if (iVar11 == 0x18 && uVar3 == 0x40) {
        sVar12 = (size_t)(iVar10 * iVar13 * 3);
        __dest = malloc(sVar12);
        memcpy(__dest,puVar7,sVar12);
        iVar11 = 4;
        goto LAB_00139ca0;
      }
      if (uVar3 == 0x41) {
        if (iVar11 == 0x20) {
          sVar12 = (size_t)(iVar10 * iVar13 * 4);
          __dest = malloc(sVar12);
          memcpy(__dest,puVar7,sVar12);
          iVar11 = 7;
          if (0 < iVar10 * iVar13) {
            lVar8 = 0;
            do {
              uVar2 = *(undefined1 *)((long)__dest + lVar8);
              *(undefined1 *)((long)__dest + lVar8) = *(undefined1 *)((long)__dest + lVar8 + 2);
              *(undefined1 *)((long)__dest + lVar8 + 2) = uVar2;
              lVar8 = lVar8 + 4;
            } while (lVar8 < (long)sVar12);
          }
          goto LAB_00139ca0;
        }
      }
      else if ((uVar3 & 0xfffffffe) == 4) {
        iVar4 = *(int *)(fileData + 0x54);
        iVar11 = 0;
        if (iVar4 == 0) {
          __dest = (void *)0x0;
        }
        else {
          local_118 = (size_t)(*(int *)(fileData + 0x14) << (1 < uVar6));
          __dest = malloc(local_118);
          memcpy(__dest,puVar7,local_118);
          if (iVar4 == 0x31545844) {
            iVar11 = (uVar3 != 4) + 0xb;
          }
          else if (iVar4 == 0x33545844) {
            iVar11 = 0xd;
          }
          else if (iVar4 == 0x35545844) {
            iVar11 = 0xe;
          }
        }
        goto LAB_00139ca0;
      }
    }
  }
  __dest = (void *)0x0;
  iVar11 = 0;
LAB_00139ca0:
  __return_storage_ptr__->data = __dest;
  __return_storage_ptr__->width = iVar13;
  __return_storage_ptr__->height = iVar10;
  __return_storage_ptr__->mipmaps = iVar14;
  __return_storage_ptr__->format = iVar11;
  return __return_storage_ptr__;
}

Assistant:

Image LoadImageFromMemory(const char *fileType, const unsigned char *fileData, int dataSize)
{
    Image image = { 0 };

    char fileExtLower[16] = { 0 };
    strcpy(fileExtLower, TextToLower(fileType));

#if defined(SUPPORT_FILEFORMAT_PNG)
    if ((TextIsEqual(fileExtLower, ".png"))
#else
    if ((false)
#endif
#if defined(SUPPORT_FILEFORMAT_BMP)
        || (TextIsEqual(fileExtLower, ".bmp"))
#endif
#if defined(SUPPORT_FILEFORMAT_TGA)
        || (TextIsEqual(fileExtLower, ".tga"))
#endif
#if defined(SUPPORT_FILEFORMAT_JPG)
        || (TextIsEqual(fileExtLower, ".jpg") ||
            TextIsEqual(fileExtLower, ".jpeg"))
#endif
#if defined(SUPPORT_FILEFORMAT_GIF)
        || (TextIsEqual(fileExtLower, ".gif"))
#endif
#if defined(SUPPORT_FILEFORMAT_PIC)
        || (TextIsEqual(fileExtLower, ".pic"))
#endif
#if defined(SUPPORT_FILEFORMAT_PSD)
        || (TextIsEqual(fileExtLower, ".psd"))
#endif
       )
    {
#if defined(STBI_REQUIRED)
        // NOTE: Using stb_image to load images (Supports multiple image formats)

        if (fileData != NULL)
        {
            int comp = 0;
            image.data = stbi_load_from_memory(fileData, dataSize, &image.width, &image.height, &comp, 0);

            image.mipmaps = 1;

            if (comp == 1) image.format = PIXELFORMAT_UNCOMPRESSED_GRAYSCALE;
            else if (comp == 2) image.format = PIXELFORMAT_UNCOMPRESSED_GRAY_ALPHA;
            else if (comp == 3) image.format = PIXELFORMAT_UNCOMPRESSED_R8G8B8;
            else if (comp == 4) image.format = PIXELFORMAT_UNCOMPRESSED_R8G8B8A8;
        }
#endif
    }
#if defined(SUPPORT_FILEFORMAT_HDR)
    else if (TextIsEqual(fileExtLower, ".hdr"))
    {
#if defined(STBI_REQUIRED)
        if (fileData != NULL)
        {
            int comp = 0;
            image.data = stbi_loadf_from_memory(fileData, dataSize, &image.width, &image.height, &comp, 0);

            image.mipmaps = 1;

            if (comp == 1) image.format = PIXELFORMAT_UNCOMPRESSED_R32;
            else if (comp == 3) image.format = PIXELFORMAT_UNCOMPRESSED_R32G32B32;
            else if (comp == 4) image.format = PIXELFORMAT_UNCOMPRESSED_R32G32B32A32;
            else
            {
                TRACELOG(LOG_WARNING, "IMAGE: HDR file format not supported");
                UnloadImage(image);
            }
        }
#endif
    }
#endif
#if defined(SUPPORT_FILEFORMAT_DDS)
    else if (TextIsEqual(fileExtLower, ".dds")) image = LoadDDS(fileData, dataSize);
#endif
#if defined(SUPPORT_FILEFORMAT_PKM)
    else if (TextIsEqual(fileExtLower, ".pkm")) image = LoadPKM(fileData, dataSize);
#endif
#if defined(SUPPORT_FILEFORMAT_KTX)
    else if (TextIsEqual(fileExtLower, ".ktx")) image = LoadKTX(fileData, dataSize);
#endif
#if defined(SUPPORT_FILEFORMAT_PVR)
    else if (TextIsEqual(fileExtLower, ".pvr")) image = LoadPVR(fileData, dataSize);
#endif
#if defined(SUPPORT_FILEFORMAT_ASTC)
    else if (TextIsEqual(fileExtLower, ".astc")) image = LoadASTC(fileData, dataSize);
#endif
    else TRACELOG(LOG_WARNING, "IMAGE: File format not supported");

    return image;
}